

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O3

void __thiscall
p2t::Sweep::FillLeftConvexEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Point *pPVar1;
  double dVar2;
  Point *pPVar3;
  Node *pNVar4;
  Node *pNVar5;
  Point *pPVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  pNVar4 = node->prev;
  pPVar1 = pNVar4->prev->point;
  pPVar6 = pNVar4->point;
  pNVar5 = pNVar4->prev;
  dVar7 = pPVar1->x;
  dVar9 = pPVar1->y;
  dVar10 = pNVar4->point->x;
  while( true ) {
    dVar8 = dVar7;
    pPVar3 = pPVar1;
    pPVar1 = pNVar5->prev->point;
    dVar7 = pPVar1->x;
    dVar2 = pPVar1->y;
    dVar10 = (dVar9 - dVar2) * (dVar10 - dVar7) - (dVar8 - dVar7) * (pPVar6->y - dVar2);
    if ((1e-12 <= ABS(dVar10)) && (dVar10 <= 0.0)) break;
    dVar10 = edge->p->x;
    dVar11 = edge->p->y;
    dVar11 = (dVar9 - dVar11) * (edge->q->x - dVar10) - (dVar8 - dVar10) * (edge->q->y - dVar11);
    if ((ABS(dVar11) < 1e-12) ||
       (pNVar4 = pNVar5, pPVar6 = pPVar3, pNVar5 = pNVar5->prev, dVar9 = dVar2, dVar10 = dVar8,
       0.0 < dVar11)) {
      return;
    }
  }
  pNVar5 = pNVar4->prev;
  while( true ) {
    Fill(this,tcx,pNVar5);
    pNVar5 = pNVar4->prev;
    pPVar1 = pNVar5->point;
    pPVar6 = edge->p;
    if (pPVar1 == pPVar6) {
      return;
    }
    dVar7 = (pPVar1->y - pPVar6->y) * (edge->q->x - pPVar6->x) -
            (pPVar1->x - pPVar6->x) * (edge->q->y - pPVar6->y);
    if (ABS(dVar7) < 1e-12) {
      return;
    }
    if (0.0 < dVar7) {
      return;
    }
    pPVar6 = pNVar5->prev->point;
    dVar7 = pPVar6->x;
    dVar9 = pPVar6->y;
    dVar7 = (pPVar1->y - dVar9) * (pNVar4->point->x - dVar7) -
            (pPVar1->x - dVar7) * (pNVar4->point->y - dVar9);
    if (ABS(dVar7) < 1e-12) break;
    if (0.0 < dVar7) {
      return;
    }
  }
  return;
}

Assistant:

void Sweep::FillLeftConvexEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  // Next concave or convex?
  if (Orient2d(*node.prev->point, *node.prev->prev->point, *node.prev->prev->prev->point) == CW) {
    // Concave
    FillLeftConcaveEdgeEvent(tcx, edge, *node.prev);
  } else{
    // Convex
    // Next above or below edge?
    if (Orient2d(*edge->q, *node.prev->prev->point, *edge->p) == CW) {
      // Below
      FillLeftConvexEdgeEvent(tcx, edge, *node.prev);
    } else{
      // Above
    }
  }
}